

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O1

void device_reset_daccontrol(void *info)

{
  *(undefined8 *)info = 0;
  *(undefined8 *)((long)info + 8) = 0;
  *(undefined1 *)((long)info + 0x50) = 0xff;
  *(undefined2 *)((long)info + 0x52) = 0;
  *(undefined1 *)((long)info + 0x54) = 0;
  *(undefined8 *)((long)info + 0x5c) = 0;
  *(undefined8 *)((long)info + 0x68) = 0;
  *(undefined8 *)((long)info + 0x6e) = 0;
  *(undefined2 *)((long)info + 0x7c) = 0xff;
  *(undefined8 *)((long)info + 0x88) = 0;
  *(undefined8 *)((long)info + 0x90) = 0;
  *(undefined1 *)((long)info + 0x98) = 0;
  return;
}

Assistant:

void device_reset_daccontrol(void* info)
{
	dac_control* chip = (dac_control*)info;
	
	chip->devDef = NULL;
	chip->chipData = NULL;
	chip->DstChipType = 0xFF;
	chip->DstCommand = 0x00;
	chip->CmdSize = 0x00;
	
	chip->Frequency = 0;
	chip->DataLen = 0x00;
	chip->Data = NULL;
	chip->DataStart = 0x00;
	chip->StepSize = 0x00;
	chip->StepBase = 0x00;
	
	chip->Running = 0xFF;
	chip->Reverse = 0x00;
	RC_RESET(&chip->stepCntr);
	chip->RealPos = 0x00;
	chip->RemainCmds = 0x00;
	chip->DataStep = 0x00;
	
	return;
}